

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::OrientationError::operator==(OrientationError *this,OrientationError *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__b_> local_58;
  KFIXED<short,_(unsigned_char)__b_> local_48;
  KFIXED<short,_(unsigned_char)__b_> local_38;
  
  local_38.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221d88;
  local_38.m_Val = (Value->m_AziErr).m_Val;
  KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_AziErr,&local_38);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  if (!KVar1) {
    local_48.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221d88;
    local_48.m_Val = (Value->m_ElvErr).m_Val;
    KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_ElvErr,&local_48);
    DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
    if (!KVar1) {
      local_58.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221d88;
      local_58.m_Val = (Value->m_RotErr).m_Val;
      KVar1 = KFIXED<short,_(unsigned_char)'\b'>::operator!=(&this->m_RotErr,&local_58);
      DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
      return !KVar1;
    }
  }
  return false;
}

Assistant:

KBOOL OrientationError::operator == ( const OrientationError & Value ) const
{
    if( m_AziErr != Value.m_AziErr )return false;
    if( m_ElvErr != Value.m_ElvErr )return false;
    if( m_RotErr != Value.m_RotErr )return false;
    return true;
}